

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::ChannelsSplit(ImDrawList *this,int channels_count)

{
  ImVec4 *pIVar1;
  undefined8 *puVar2;
  int *piVar3;
  int iVar4;
  ImDrawChannel *pIVar5;
  void *pvVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  long lVar9;
  ImDrawChannel *__dest;
  long lVar10;
  void *pvVar11;
  long lVar12;
  void *__dest_00;
  long lVar13;
  char *__function;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  
  if ((this->_ChannelsCurrent != 0) || (this->_ChannelsCount != 1)) {
    __assert_fail("_ChannelsCurrent == 0 && _ChannelsCount == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui_draw.cpp"
                  ,0x20e,"void ImDrawList::ChannelsSplit(int)");
  }
  iVar4 = (this->_Channels).Size;
  if (iVar4 < channels_count) {
    iVar17 = (this->_Channels).Capacity;
    if (iVar17 < channels_count) {
      if (iVar17 == 0) {
        iVar18 = 8;
      }
      else {
        iVar18 = iVar17 / 2 + iVar17;
      }
      if (iVar18 <= channels_count) {
        iVar18 = channels_count;
      }
      if (iVar17 < iVar18) {
        __dest = (ImDrawChannel *)ImGui::MemAlloc((long)iVar18 << 5);
        pIVar5 = (this->_Channels).Data;
        if (pIVar5 != (ImDrawChannel *)0x0) {
          memcpy(__dest,pIVar5,(long)(this->_Channels).Size << 5);
          ImGui::MemFree((this->_Channels).Data);
        }
        (this->_Channels).Data = __dest;
        (this->_Channels).Capacity = iVar18;
      }
    }
    (this->_Channels).Size = channels_count;
  }
  this->_ChannelsCount = channels_count;
  if ((this->_Channels).Size < 1) {
LAB_0010a180:
    __assert_fail("i < Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.h"
                  ,0x4d7,"T &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]");
  }
  pIVar5 = (this->_Channels).Data;
  (pIVar5->IdxBuffer).Size = 0;
  (pIVar5->IdxBuffer).Capacity = 0;
  (pIVar5->IdxBuffer).Data = (unsigned_short *)0x0;
  (pIVar5->CmdBuffer).Size = 0;
  (pIVar5->CmdBuffer).Capacity = 0;
  (pIVar5->CmdBuffer).Data = (ImDrawCmd *)0x0;
  if (1 < channels_count) {
    uVar14 = 1;
    lVar15 = 0x38;
    do {
      lVar10 = (long)(this->_Channels).Size;
      if ((long)uVar14 < (long)iVar4) {
        if (lVar10 <= (long)uVar14) goto LAB_0010a180;
        pIVar5 = (this->_Channels).Data;
        iVar17 = *(int *)((long)pIVar5 + lVar15 + -0x14);
        if (iVar17 < 0) {
          uVar16 = iVar17 / 2 + iVar17;
          if ((int)uVar16 < 1) {
            uVar16 = 0;
          }
          pvVar11 = ImGui::MemAlloc((ulong)uVar16 * 0x30);
          pvVar6 = *(void **)((long)pIVar5 + lVar15 + -0x10);
          if (pvVar6 != (void *)0x0) {
            memcpy(pvVar11,pvVar6,(long)*(int *)((long)pIVar5 + lVar15 + -0x18) * 0x30);
            ImGui::MemFree(*(void **)((long)pIVar5 + lVar15 + -0x10));
          }
          *(void **)((long)pIVar5 + lVar15 + -0x10) = pvVar11;
          *(uint *)((long)pIVar5 + lVar15 + -0x14) = uVar16;
        }
        *(undefined4 *)((long)pIVar5 + lVar15 + -0x18) = 0;
        if ((long)(this->_Channels).Size <= (long)uVar14) goto LAB_0010a180;
        pIVar5 = (this->_Channels).Data;
        iVar17 = *(int *)((long)pIVar5 + lVar15 + -4);
        if (iVar17 < 0) {
          iVar17 = iVar17 / 2 + iVar17;
          if (iVar17 < 1) {
            iVar17 = 0;
          }
          pvVar11 = ImGui::MemAlloc((ulong)(uint)(iVar17 * 2));
          pvVar6 = *(void **)((long)&(pIVar5->CmdBuffer).Size + lVar15);
          if (pvVar6 != (void *)0x0) {
            memcpy(pvVar11,pvVar6,(long)*(int *)((long)pIVar5 + lVar15 + -8) * 2);
            ImGui::MemFree(*(void **)((long)&(pIVar5->CmdBuffer).Size + lVar15));
          }
          *(void **)((long)&(pIVar5->CmdBuffer).Size + lVar15) = pvVar11;
          *(int *)((long)pIVar5 + lVar15 + -4) = iVar17;
        }
        *(undefined4 *)((long)pIVar5 + lVar15 + -8) = 0;
      }
      else {
        if (lVar10 <= (long)uVar14) goto LAB_0010a180;
        pIVar5 = (this->_Channels).Data;
        puVar2 = (undefined8 *)((long)pIVar5 + lVar15 + -8);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)pIVar5 + lVar15 + -0x18);
        *puVar2 = 0;
        puVar2[1] = 0;
      }
      if ((long)(this->_Channels).Size <= (long)uVar14) goto LAB_0010a180;
      pIVar5 = (this->_Channels).Data;
      if (*(int *)((long)pIVar5 + lVar15 + -0x18) == 0) {
        lVar10 = (long)(this->_ClipRectStack).Size;
        if (lVar10 < 1) {
          __function = "T &ImVector<ImVec4>::back() [T = ImVec4]";
LAB_0010a1cb:
          __assert_fail("Size > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.h"
                        ,0x4e1,__function);
        }
        pIVar1 = (this->_ClipRectStack).Data + lVar10 + -1;
        lVar10._0_4_ = pIVar1->x;
        lVar10._4_4_ = pIVar1->y;
        uVar7 = pIVar1->z;
        uVar8 = pIVar1->w;
        lVar12 = (long)(this->_TextureIdStack).Size;
        if (lVar12 < 1) {
          __function = "T &ImVector<void *>::back() [T = void *]";
          goto LAB_0010a1cb;
        }
        pvVar6 = (this->_TextureIdStack).Data[lVar12 + -1];
        if (*(int *)((long)pIVar5 + lVar15 + -0x14) == 0) {
          __dest_00 = ImGui::MemAlloc(0x180);
          pvVar11 = *(void **)((long)pIVar5 + lVar15 + -0x10);
          if (pvVar11 != (void *)0x0) {
            memcpy(__dest_00,pvVar11,(long)*(int *)((long)pIVar5 + lVar15 + -0x18) * 0x30);
            ImGui::MemFree(*(void **)((long)pIVar5 + lVar15 + -0x10));
          }
          *(void **)((long)pIVar5 + lVar15 + -0x10) = __dest_00;
          *(undefined4 *)((long)pIVar5 + lVar15 + -0x14) = 8;
        }
        lVar12 = *(long *)((long)pIVar5 + lVar15 + -0x10);
        lVar13 = (long)*(int *)((long)pIVar5 + lVar15 + -0x18) * 0x30;
        *(ulong *)(lVar12 + 0x10 + lVar13) = CONCAT44(uStack_34,uVar8);
        lVar9 = CONCAT44(uVar7,lVar10._4_4_);
        *(long *)(lVar12 + lVar13) = lVar10 << 0x20;
        ((long *)(lVar12 + lVar13))[1] = lVar9;
        *(void **)(lVar12 + 0x18 + lVar13) = pvVar6;
        puVar2 = (undefined8 *)(lVar12 + 0x20 + lVar13);
        *puVar2 = 0;
        puVar2[1] = 0;
        piVar3 = (int *)((long)pIVar5 + lVar15 + -0x18);
        *piVar3 = *piVar3 + 1;
      }
      uVar14 = uVar14 + 1;
      lVar15 = lVar15 + 0x20;
    } while ((uint)channels_count != uVar14);
  }
  return;
}

Assistant:

void ImDrawList::ChannelsSplit(int channels_count)
{
    IM_ASSERT(_ChannelsCurrent == 0 && _ChannelsCount == 1);
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
        _Channels.resize(channels_count);
    _ChannelsCount = channels_count;

    // _Channels[] (24/32 bytes each) hold storage that we'll swap with this->_CmdBuffer/_IdxBuffer
    // The content of _Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy _CmdBuffer/_IdxBuffer into _Channels[0] and then _Channels[1] into _CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i].CmdBuffer.resize(0);
            _Channels[i].IdxBuffer.resize(0);
        }
        if (_Channels[i].CmdBuffer.Size == 0)
        {
            ImDrawCmd draw_cmd;
            draw_cmd.ClipRect = _ClipRectStack.back();
            draw_cmd.TextureId = _TextureIdStack.back();
            _Channels[i].CmdBuffer.push_back(draw_cmd);
        }
    }
}